

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<bool_(unsigned_short)>::Matches
          (OnCallSpec<bool_(unsigned_short)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = MatcherBase<unsigned_short>::Matches
                    ((MatcherBase<unsigned_short> *)(this + 0x10),(unsigned_short *)args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<unsigned_short>_&>::Matches
                      ((MatcherBase<const_std::tuple<unsigned_short>_&> *)(this + 0x28),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }